

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::Instance>::RefPtr
          (RefPtr<wabt::interp::Instance> *this,Store *store,Ref ref)

{
  Store *pSVar1;
  Store *pSVar2;
  bool bVar3;
  Index IVar4;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar5;
  size_type __n;
  Store *pSVar6;
  undefined8 *extraout_RDX;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar7;
  Ref local_20;
  
  bVar3 = Store::Is<wabt::interp::Instance>(store,ref);
  if (!bVar3) {
    interp::RefPtr();
    __n = std::
          vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
          ::_M_check_len((vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                          *)ref.index,1,"vector::_M_realloc_insert");
    pSVar1 = *(Store **)ref.index;
    pSVar2 = *(Store **)(ref.index + 8);
    if (__n == 0) {
      puVar5 = (unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *)0x0;
    }
    else {
      puVar5 = __gnu_cxx::
               new_allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
               ::allocate((new_allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                           *)ref.index,__n,(void *)0x0);
    }
    puVar5[(long)store - (long)pSVar1 >> 3]._M_t.
    super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>._M_t.
    super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
    super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl = (Object *)*extraout_RDX;
    puVar7 = puVar5;
    for (pSVar6 = pSVar1; pSVar6 != store;
        pSVar6 = (Store *)&(pSVar6->features_).bulk_memory_enabled_) {
      (puVar7->_M_t).
      super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>._M_t.
      super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
      super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl =
           *(Object **)&pSVar6->features_;
      (pSVar6->features_).exceptions_enabled_ = false;
      (pSVar6->features_).mutable_globals_enabled_ = false;
      (pSVar6->features_).sat_float_to_int_enabled_ = false;
      (pSVar6->features_).sign_extension_enabled_ = false;
      (pSVar6->features_).simd_enabled_ = false;
      (pSVar6->features_).threads_enabled_ = false;
      (pSVar6->features_).multi_value_enabled_ = false;
      (pSVar6->features_).tail_call_enabled_ = false;
      puVar7 = puVar7 + 1;
    }
    for (; puVar7 = puVar7 + 1, pSVar2 != store;
        store = (Store *)&(store->features_).bulk_memory_enabled_) {
      (puVar7->_M_t).
      super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>._M_t.
      super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
      super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl =
           *(Object **)&store->features_;
      (store->features_).exceptions_enabled_ = false;
      (store->features_).mutable_globals_enabled_ = false;
      (store->features_).sat_float_to_int_enabled_ = false;
      (store->features_).sign_extension_enabled_ = false;
      (store->features_).simd_enabled_ = false;
      (store->features_).threads_enabled_ = false;
      (store->features_).multi_value_enabled_ = false;
      (store->features_).tail_call_enabled_ = false;
    }
    if (pSVar1 != (Store *)0x0) {
      operator_delete(pSVar1);
    }
    *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)ref.index =
         puVar5;
    *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)
     (ref.index + 8) = puVar7;
    *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)
     (ref.index + 0x10) = puVar5 + __n;
    return;
  }
  local_20.index = ref.index;
  IVar4 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
  this->root_index_ = IVar4;
  puVar5 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           ::Get(&store->objects_,ref.index);
  this->obj_ = (Instance *)
               (puVar5->_M_t).
               super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
               .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
  this->store_ = store;
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}